

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O2

void transpose_uint32_aos_to_soa(char *filename)

{
  int val;
  uint32_t i;
  ulong uVar1;
  uint32_t nr_of_triangles;
  uint8_t *b1;
  uint32_t *triangles;
  uint32_t *triangles_from_b1b2b3b4;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  float *vertices;
  uint32_t nr_of_vertices;
  
  val = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x29,"void transpose_uint32_aos_to_soa(const char *)");
  uVar1 = (ulong)(nr_of_triangles * 3);
  b1 = (uint8_t *)malloc(uVar1);
  b2 = (uint8_t *)malloc(uVar1);
  b3 = (uint8_t *)malloc(uVar1);
  b4 = (uint8_t *)malloc(uVar1);
  anon_unknown.dwarf_7fc0::tic();
  trico_transpose_uint32_aos_to_soa(&b1,&b2,&b3,&b4,triangles,nr_of_triangles * 3);
  anon_unknown.dwarf_7fc0::toc("transpose_uint32_aos_to_soa time: ");
  triangles_from_b1b2b3b4 = (uint32_t *)malloc((ulong)(nr_of_triangles * 3) << 2);
  anon_unknown.dwarf_7fc0::tic();
  trico_transpose_uint32_soa_to_aos(&triangles_from_b1b2b3b4,b1,b2,b3,b4,nr_of_triangles * 3);
  anon_unknown.dwarf_7fc0::toc("transpose_uint32_soa_to_aos time: ");
  for (uVar1 = 0; uVar1 < nr_of_triangles * 3; uVar1 = uVar1 + 1) {
    TestEq<unsigned_int,unsigned_int>
              (triangles[uVar1],triangles_from_b1b2b3b4[uVar1],
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
               ,0x3e,"void transpose_uint32_aos_to_soa(const char *)");
  }
  free(triangles_from_b1b2b3b4);
  free(b1);
  free(b2);
  free(b3);
  free(b4);
  free(vertices);
  free(triangles);
  return;
}

Assistant:

void transpose_uint32_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);


  tic();
  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);
  toc("transpose_uint32_aos_to_soa time: ");


  uint32_t* triangles_from_b1b2b3b4 = (uint32_t*)trico_malloc(nr_of_triangles * 3 * sizeof(uint32_t));

  tic();
  trico_transpose_uint32_soa_to_aos(&triangles_from_b1b2b3b4, b1, b2, b3, b4, nr_of_triangles * 3);
  toc("transpose_uint32_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_triangles * 3; ++i)
    {
    TEST_EQ(triangles[i], triangles_from_b1b2b3b4[i]);
    }

  trico_free(triangles_from_b1b2b3b4);
  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  trico_free(vertices);
  trico_free(triangles);
  }